

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

descriptor_state * __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::alloc
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this)

{
  descriptor_state *pdVar1;
  descriptor_state **ppdVar2;
  descriptor_state *local_18;
  descriptor_state *o;
  object_pool<asio::detail::epoll_reactor::descriptor_state> *this_local;
  
  local_18 = this->free_list_;
  if (local_18 == (descriptor_state *)0x0) {
    local_18 = object_pool_access::create<asio::detail::epoll_reactor::descriptor_state>();
  }
  else {
    ppdVar2 = object_pool_access::next<asio::detail::epoll_reactor::descriptor_state>
                        (this->free_list_);
    this->free_list_ = *ppdVar2;
  }
  pdVar1 = this->live_list_;
  ppdVar2 = object_pool_access::next<asio::detail::epoll_reactor::descriptor_state>(local_18);
  *ppdVar2 = pdVar1;
  ppdVar2 = object_pool_access::prev<asio::detail::epoll_reactor::descriptor_state>(local_18);
  *ppdVar2 = (descriptor_state *)0x0;
  if (this->live_list_ != (descriptor_state *)0x0) {
    ppdVar2 = object_pool_access::prev<asio::detail::epoll_reactor::descriptor_state>
                        (this->live_list_);
    *ppdVar2 = local_18;
  }
  this->live_list_ = local_18;
  return local_18;
}

Assistant:

Object* alloc()
  {
    Object* o = free_list_;
    if (o)
      free_list_ = object_pool_access::next(free_list_);
    else
      o = object_pool_access::create<Object>();

    object_pool_access::next(o) = live_list_;
    object_pool_access::prev(o) = 0;
    if (live_list_)
      object_pool_access::prev(live_list_) = o;
    live_list_ = o;

    return o;
  }